

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  U32 UVar1;
  U32 UVar2;
  ushort uVar3;
  U32 curr;
  size_t sVar4;
  size_t sVar5;
  U32 UVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  HUF_CElt *elt;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U32 rankVal [13];
  BYTE huffWeight [256];
  U16 nbPerRank [14];
  
  tableLog = 0;
  nbSymbols = 0;
  sVar4 = HUF_readStats_wksp(huffWeight,0x100,rankVal,&nbSymbols,&tableLog,src,srcSize,nbPerRank,
                             0x36c,0);
  UVar2 = nbSymbols;
  sVar5 = sVar4;
  if (sVar4 < 0xffffffffffffff89) {
    *hasZeroWeights = (uint)(rankVal[0] != 0);
    uVar8 = (ulong)tableLog;
    sVar5 = 0xffffffffffffffd4;
    if (uVar8 < 0xd) {
      uVar11 = (ulong)nbSymbols;
      sVar5 = 0xffffffffffffffd0;
      if (nbSymbols <= *maxSymbolValuePtr + 1) {
        *CTable = uVar8;
        if (tableLog != 0) {
          uVar7 = 0;
          UVar6 = 0;
          do {
            UVar1 = rankVal[uVar7 + 1];
            bVar10 = (byte)uVar7;
            rankVal[uVar7 + 1] = UVar6;
            uVar7 = uVar7 + 1;
            UVar6 = (UVar1 << (bVar10 & 0x1f)) + UVar6;
          } while (uVar8 != uVar7);
        }
        elt = CTable + 1;
        if (uVar11 != 0) {
          lVar9 = 0;
          do {
            bVar10 = ((char)tableLog + '\x01') - huffWeight[lVar9];
            if (huffWeight[lVar9] == '\0') {
              bVar10 = 0;
            }
            if (0xc < bVar10) {
              __assert_fail("nbBits <= HUF_TABLELOG_ABSOLUTEMAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x3bae,"void HUF_setNbBits(HUF_CElt *, size_t)");
            }
            elt[lVar9] = (ulong)bVar10;
            lVar9 = lVar9 + 1;
          } while (nbSymbols != (U32)lVar9);
        }
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0xd] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank[8] = 0;
        valPerRank[9] = 0;
        valPerRank[10] = 0;
        valPerRank[0xb] = 0;
        valPerRank[0xc] = 0;
        valPerRank[0xd] = 0;
        valPerRank[0] = 0;
        valPerRank[1] = 0;
        valPerRank[2] = 0;
        valPerRank[3] = 0;
        valPerRank[4] = 0;
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        if (uVar11 != 0) {
          uVar7 = 0;
          do {
            nbPerRank[(byte)elt[uVar7]] = nbPerRank[(byte)elt[uVar7]] + 1;
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
        }
        valPerRank[uVar8 + 1] = 0;
        if (tableLog != 0) {
          uVar3 = 0;
          UVar6 = tableLog;
          do {
            valPerRank[uVar8] = uVar3;
            uVar3 = (ushort)(uVar3 + nbPerRank[uVar8]) >> 1;
            uVar8 = uVar8 - 1;
            UVar6 = UVar6 - 1;
          } while (UVar6 != 0);
        }
        for (; uVar11 != 0; uVar11 = uVar11 - 1) {
          uVar3 = valPerRank[(byte)*elt];
          valPerRank[(byte)*elt] = uVar3 + 1;
          HUF_setValue(elt,(ulong)uVar3);
          elt = elt + 1;
        }
        *maxSymbolValuePtr = UVar2 - 1;
        sVar5 = sVar4;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    CTable[0] = tableLog;

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}